

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomDateTime::write(DomDateTime *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffd58;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffd60;
  QAnyStringView *in_stack_fffffffffffffd68;
  QAnyStringView *in_stack_fffffffffffffd70;
  QAnyStringView *in_stack_fffffffffffffd78;
  undefined1 local_228 [64];
  QAnyStringView *local_1e8;
  undefined1 local_1d8 [64];
  QAnyStringView *local_198;
  undefined1 local_188 [64];
  QAnyStringView *local_148;
  undefined1 local_138 [64];
  QAnyStringView *local_f8;
  undefined1 local_e8 [64];
  QAnyStringView *local_a8;
  undefined1 local_98 [64];
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1bca29);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"datetime",8);
    QString::QString((QString *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffd58);
  }
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1bcadc);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd60);
  }
  if ((this->m_children & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::number((int)local_98,this->m_hour);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_58);
    QString::~QString((QString *)0x1bcba3);
    QString::~QString((QString *)0x1bcbb0);
  }
  if ((this->m_children & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::number((int)local_e8,this->m_minute);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_a8);
    QString::~QString((QString *)0x1bcc61);
    QString::~QString((QString *)0x1bcc6e);
  }
  if ((this->m_children & 4) != 0) {
    in_stack_fffffffffffffd78 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffd70);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::number((int)local_138,this->m_second);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffd78,local_f8);
    QString::~QString((QString *)0x1bcd1f);
    QString::~QString((QString *)0x1bcd2c);
  }
  if ((this->m_children & 8) != 0) {
    in_stack_fffffffffffffd70 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd78,(size_t)str_00);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::number((int)local_188,this->m_year);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffd70,local_148);
    QString::~QString((QString *)0x1bcddd);
    QString::~QString((QString *)0x1bcdea);
  }
  if ((this->m_children & 0x10) != 0) {
    in_stack_fffffffffffffd68 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::number((int)local_1d8,this->m_month);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffd68,local_198);
    QString::~QString((QString *)0x1bce9b);
    QString::~QString((QString *)0x1bcea8);
  }
  if ((this->m_children & 0x20) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::number((int)local_228,this->m_day);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_1e8);
    QString::~QString((QString *)0x1bcf59);
    QString::~QString((QString *)0x1bcf66);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomDateTime::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("datetime") : tagName.toLower());

    if (m_children & Hour)
        writer.writeTextElement(u"hour"_s, QString::number(m_hour));

    if (m_children & Minute)
        writer.writeTextElement(u"minute"_s, QString::number(m_minute));

    if (m_children & Second)
        writer.writeTextElement(u"second"_s, QString::number(m_second));

    if (m_children & Year)
        writer.writeTextElement(u"year"_s, QString::number(m_year));

    if (m_children & Month)
        writer.writeTextElement(u"month"_s, QString::number(m_month));

    if (m_children & Day)
        writer.writeTextElement(u"day"_s, QString::number(m_day));

    writer.writeEndElement();
}